

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viff.cxx
# Opt level: O2

void __thiscall vigra::ViffDecoder::~ViffDecoder(ViffDecoder *this)

{
  ViffDecoderImpl *this_00;
  
  (this->super_Decoder)._vptr_Decoder = (_func_int **)&PTR__ViffDecoder_0015aa00;
  this_00 = this->pimpl;
  if (this_00 != (ViffDecoderImpl *)0x0) {
    ViffDecoderImpl::~ViffDecoderImpl(this_00);
  }
  operator_delete(this_00);
  Decoder::~Decoder(&this->super_Decoder);
  return;
}

Assistant:

ViffDecoder::~ViffDecoder()
    {
        delete pimpl;
    }